

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001ea000 = 0x2d2d2d2d2d2d2d;
    uRam00000000001ea007._0_1_ = '-';
    uRam00000000001ea007._1_1_ = '-';
    uRam00000000001ea007._2_1_ = '-';
    uRam00000000001ea007._3_1_ = '-';
    uRam00000000001ea007._4_1_ = '-';
    uRam00000000001ea007._5_1_ = '-';
    uRam00000000001ea007._6_1_ = '-';
    uRam00000000001ea007._7_1_ = '-';
    DAT_001e9ff0 = '-';
    DAT_001e9ff0_1._0_1_ = '-';
    DAT_001e9ff0_1._1_1_ = '-';
    DAT_001e9ff0_1._2_1_ = '-';
    DAT_001e9ff0_1._3_1_ = '-';
    DAT_001e9ff0_1._4_1_ = '-';
    DAT_001e9ff0_1._5_1_ = '-';
    DAT_001e9ff0_1._6_1_ = '-';
    uRam00000000001e9ff8 = 0x2d2d2d2d2d2d2d;
    DAT_001e9fff = 0x2d;
    DAT_001e9fe0 = '-';
    DAT_001e9fe0_1._0_1_ = '-';
    DAT_001e9fe0_1._1_1_ = '-';
    DAT_001e9fe0_1._2_1_ = '-';
    DAT_001e9fe0_1._3_1_ = '-';
    DAT_001e9fe0_1._4_1_ = '-';
    DAT_001e9fe0_1._5_1_ = '-';
    DAT_001e9fe0_1._6_1_ = '-';
    uRam00000000001e9fe8._0_1_ = '-';
    uRam00000000001e9fe8._1_1_ = '-';
    uRam00000000001e9fe8._2_1_ = '-';
    uRam00000000001e9fe8._3_1_ = '-';
    uRam00000000001e9fe8._4_1_ = '-';
    uRam00000000001e9fe8._5_1_ = '-';
    uRam00000000001e9fe8._6_1_ = '-';
    uRam00000000001e9fe8._7_1_ = '-';
    DAT_001e9fd0 = '-';
    DAT_001e9fd0_1._0_1_ = '-';
    DAT_001e9fd0_1._1_1_ = '-';
    DAT_001e9fd0_1._2_1_ = '-';
    DAT_001e9fd0_1._3_1_ = '-';
    DAT_001e9fd0_1._4_1_ = '-';
    DAT_001e9fd0_1._5_1_ = '-';
    DAT_001e9fd0_1._6_1_ = '-';
    uRam00000000001e9fd8._0_1_ = '-';
    uRam00000000001e9fd8._1_1_ = '-';
    uRam00000000001e9fd8._2_1_ = '-';
    uRam00000000001e9fd8._3_1_ = '-';
    uRam00000000001e9fd8._4_1_ = '-';
    uRam00000000001e9fd8._5_1_ = '-';
    uRam00000000001e9fd8._6_1_ = '-';
    uRam00000000001e9fd8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001e9fc8._0_1_ = '-';
    uRam00000000001e9fc8._1_1_ = '-';
    uRam00000000001e9fc8._2_1_ = '-';
    uRam00000000001e9fc8._3_1_ = '-';
    uRam00000000001e9fc8._4_1_ = '-';
    uRam00000000001e9fc8._5_1_ = '-';
    uRam00000000001e9fc8._6_1_ = '-';
    uRam00000000001e9fc8._7_1_ = '-';
    DAT_001ea00f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}